

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O0

void __thiscall
Deque<int,_std::allocator<int>_>::Deque
          (Deque<int,_std::allocator<int>_> *this,allocator<int> *allocator)

{
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *in_RDI;
  allocator<int> *in_stack_ffffffffffffff98;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *this_00;
  undefined1 local_26;
  undefined1 local_25 [20];
  undefined1 local_11 [17];
  
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x1619dc);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(in_RDI,8,local_11);
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::~allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x1619fc);
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x161a19);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(in_RDI + 1,4,local_25);
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::~allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x161a39);
  this_00 = in_RDI + 2;
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x161a56);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(this_00,0x10,&local_26);
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::~allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x161a76);
  std::allocator<int>::allocator((allocator<int> *)this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

Deque(const Allocator &allocator = Allocator()) :
            small_(MIN_BUFFER_SIZE),
            current_(MIN_BUFFER_SIZE * 2),
            big_(MIN_BUFFER_SIZE * 4),
            allocator_(allocator)
    {}